

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int mriStep_SetUserData(ARKodeMem ark_mem,void *user_data)

{
  int iVar1;
  ARKodeMRIStepMem in_RAX;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_18;
  
  local_18 = in_RAX;
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetUserData",&local_18);
  if (iVar1 == 0) {
    if ((local_18->lmem != (void *)0x0) && (iVar1 = arkLSSetUserData(ark_mem,user_data), iVar1 != 0)
       ) {
      return iVar1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mriStep_SetUserData(ARKodeMem ark_mem, void* user_data)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set user data in ARKODELS mem */
  if (step_mem->lmem != NULL)
  {
    retval = arkLSSetUserData(ark_mem, user_data);
    if (retval != ARKLS_SUCCESS) { return (retval); }
  }

  return (ARK_SUCCESS);
}